

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O3

int http_file_open(char *url,int rwmode,int *handle)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int *piVar4;
  char *err_message;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int contentlength;
  FILE *httpfile;
  char contenttype [100];
  char contentencoding [100];
  char errorstr [1200];
  char recbuf [1200];
  int local_a88;
  int local_a84;
  FILE *local_a80;
  char local_a78;
  char cStack_a77;
  char cStack_a76;
  char cStack_a75;
  char cStack_a74;
  char cStack_a73;
  char cStack_a72;
  char cStack_a71;
  char cStack_a70;
  char cStack_a6f;
  char cStack_a6e;
  char cStack_a6d;
  char cStack_a6c;
  char cStack_a6b;
  char cStack_a6a;
  char cStack_a69;
  char cStack_a68;
  char cStack_a67;
  char cStack_a66;
  char cStack_a65;
  char cStack_a64;
  char cStack_a63;
  char cStack_a62;
  char cStack_a61;
  char cStack_a60;
  char cStack_a5f;
  char cStack_a5e;
  char cStack_a5d;
  undefined4 local_a08;
  undefined4 uStack_a04;
  undefined3 uStack_a00;
  char local_998 [1200];
  undefined1 local_4e8 [1208];
  
  if (netoutfile._0_4_ == 0x3a6d656d) {
    iVar1 = http_open(url,0,handle);
    return iVar1;
  }
  closehttpfile = 0;
  closefile = 0;
  closeoutfile = 0;
  sVar3 = strlen(netoutfile);
  uVar2 = (uint)sVar3;
  if (uVar2 == 0) {
    ffpmsg("Output file not set, shouldn\'t have happened (http_file_open)");
    return 0x68;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)env);
  if (iVar1 != 0) {
    ffpmsg("Timeout (http_open)");
    snprintf(local_998,0x4b0,"Download timeout exceeded: %d seconds",(ulong)net_timeout);
    ffpmsg(local_998);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    url = "   Timeout may be adjusted with fits_set_timeout";
    goto LAB_00134eaa;
  }
  signal(0xe,signal_handler);
  alarm(net_timeout);
  local_a88 = http_open_network(url,(FILE **)&local_a80,(char *)&local_a08,&local_a78,&local_a84);
  if (local_a88 != 0) {
    alarm(0);
    ffpmsg("Unable to open http file (http_file_open)");
    goto LAB_00134eaa;
  }
  closehttpfile = closehttpfile + 1;
  if (netoutfile[0] == '!') {
    if (0 < (int)uVar2) {
      memmove(netoutfile,netoutfile + 1,(ulong)(uVar2 & 0x7fffffff));
    }
    file_remove(netoutfile);
  }
  __stream = local_a80;
  uVar2 = fgetc(local_a80);
  ungetc((int)(char)uVar2,__stream);
  if ((CONCAT31((undefined3)uStack_a04,local_a08._3_1_) == 0x70697a && local_a08 == 0x7a672d78) ||
     (CONCAT35(uStack_a00,CONCAT41(uStack_a04,local_a08._3_1_)) == 0x73736572706d6f &&
      CONCAT44(uStack_a04,local_a08) == 0x6572706d6f632d78)) {
LAB_00134e81:
    local_a88 = file_create(netoutfile,handle);
    if (local_a88 != 0) goto LAB_00134e97;
    file_close(*handle);
    outfile = (FILE *)fopen(netoutfile,"w");
    if ((FILE *)outfile == (FILE *)0x0) {
      url = "Unable to reopen the output file (http_file_open)";
    }
    else {
      closeoutfile = closeoutfile + 1;
      local_a88 = 0;
      alarm(net_timeout * 10);
      local_a88 = uncompress2file(url,(FILE *)__stream,outfile,&local_a88);
      alarm(0);
      if (local_a88 == 0) {
        fclose((FILE *)outfile);
        piVar4 = &closeoutfile;
LAB_00134fb4:
        *piVar4 = *piVar4 + -1;
        fclose(__stream);
        closehttpfile = closehttpfile + -1;
        signal(0xe,(__sighandler_t)0x0);
        alarm(0);
        iVar1 = file_open(netoutfile,rwmode,handle);
        return iVar1;
      }
      err_message = "Error uncompressing http file to disk file (http_file_open)";
LAB_00134f88:
      ffpmsg(err_message);
    }
  }
  else {
    auVar5[0] = -(cStack_a75 == 'l');
    auVar5[1] = -(cStack_a74 == 'i');
    auVar5[2] = -(cStack_a73 == 'c');
    auVar5[3] = -(cStack_a72 == 'a');
    auVar5[4] = -(cStack_a71 == 't');
    auVar5[5] = -(cStack_a70 == 'i');
    auVar5[6] = -(cStack_a6f == 'o');
    auVar5[7] = -(cStack_a6e == 'n');
    auVar5[8] = -(cStack_a6d == '/');
    auVar5[9] = -(cStack_a6c == 'x');
    auVar5[10] = -(cStack_a6b == '-');
    auVar5[0xb] = -(cStack_a6a == 'g');
    auVar5[0xc] = -(cStack_a69 == 'z');
    auVar5[0xd] = -(cStack_a68 == 'i');
    auVar5[0xe] = -(cStack_a67 == 'p');
    auVar5[0xf] = -(cStack_a66 == '\0');
    auVar7[0] = -(local_a78 == 'a');
    auVar7[1] = -(cStack_a77 == 'p');
    auVar7[2] = -(cStack_a76 == 'p');
    auVar7[3] = -(cStack_a75 == 'l');
    auVar7[4] = -(cStack_a74 == 'i');
    auVar7[5] = -(cStack_a73 == 'c');
    auVar7[6] = -(cStack_a72 == 'a');
    auVar7[7] = -(cStack_a71 == 't');
    auVar7[8] = -(cStack_a70 == 'i');
    auVar7[9] = -(cStack_a6f == 'o');
    auVar7[10] = -(cStack_a6e == 'n');
    auVar7[0xb] = -(cStack_a6d == '/');
    auVar7[0xc] = -(cStack_a6c == 'x');
    auVar7[0xd] = -(cStack_a6b == '-');
    auVar7[0xe] = -(cStack_a6a == 'g');
    auVar7[0xf] = -(cStack_a69 == 'z');
    auVar7 = auVar7 & auVar5;
    if (((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) ||
       ((cStack_a68 == '\0' &&
        CONCAT17(cStack_a71,
                 CONCAT16(cStack_a72,
                          CONCAT15(cStack_a73,
                                   CONCAT14(cStack_a74,
                                            CONCAT13(cStack_a75,
                                                     CONCAT12(cStack_a76,
                                                              CONCAT11(cStack_a77,local_a78)))))))
        == 0x746163696c707061) &&
        CONCAT17(cStack_a69,
                 CONCAT16(cStack_a6a,
                          CONCAT15(cStack_a6b,
                                   CONCAT14(cStack_a6c,
                                            CONCAT13(cStack_a6d,
                                                     CONCAT12(cStack_a6e,
                                                              CONCAT11(cStack_a6f,cStack_a70)))))))
        == 0x70697a672f6e6f69)) goto LAB_00134e81;
    auVar14[0] = -(local_a78 == 'a');
    auVar14[1] = -(cStack_a77 == 'p');
    auVar14[2] = -(cStack_a76 == 'p');
    auVar14[3] = -(cStack_a75 == 'l');
    auVar14[4] = -(cStack_a74 == 'i');
    auVar14[5] = -(cStack_a73 == 'c');
    auVar14[6] = -(cStack_a72 == 'a');
    auVar14[7] = -(cStack_a71 == 't');
    auVar14[8] = -(cStack_a70 == 'i');
    auVar14[9] = -(cStack_a6f == 'o');
    auVar14[10] = -(cStack_a6e == 'n');
    auVar14[0xb] = -(cStack_a6d == '/');
    auVar14[0xc] = -(cStack_a6c == 'g');
    auVar14[0xd] = -(cStack_a6b == 'z');
    auVar14[0xe] = -(cStack_a6a == 'i');
    auVar14[0xf] = -(cStack_a69 == 'p');
    auVar11[0] = -(cStack_a6c == 'g');
    auVar11[1] = -(cStack_a6b == 'z');
    auVar11[2] = -(cStack_a6a == 'i');
    auVar11[3] = -(cStack_a69 == 'p');
    auVar11[4] = -(cStack_a68 == '-');
    auVar11[5] = -(cStack_a67 == 'c');
    auVar11[6] = -(cStack_a66 == 'o');
    auVar11[7] = -(cStack_a65 == 'm');
    auVar11[8] = -(cStack_a64 == 'p');
    auVar11[9] = -(cStack_a63 == 'r');
    auVar11[10] = -(cStack_a62 == 'e');
    auVar11[0xb] = -(cStack_a61 == 's');
    auVar11[0xc] = -(cStack_a60 == 's');
    auVar11[0xd] = -(cStack_a5f == 'e');
    auVar11[0xe] = -(cStack_a5e == 'd');
    auVar11[0xf] = -(cStack_a5d == '\0');
    auVar11 = auVar11 & auVar14;
    if ((((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) ||
        (auVar8[0] = -(local_a78 == 'a'), auVar8[1] = -(cStack_a77 == 'p'),
        auVar8[2] = -(cStack_a76 == 'p'), auVar8[3] = -(cStack_a75 == 'l'),
        auVar8[4] = -(cStack_a74 == 'i'), auVar8[5] = -(cStack_a73 == 'c'),
        auVar8[6] = -(cStack_a72 == 'a'), auVar8[7] = -(cStack_a71 == 't'),
        auVar8[8] = -(cStack_a70 == 'i'), auVar8[9] = -(cStack_a6f == 'o'),
        auVar8[10] = -(cStack_a6e == 'n'), auVar8[0xb] = -(cStack_a6d == '/'),
        auVar8[0xc] = -(cStack_a6c == 'g'), auVar8[0xd] = -(cStack_a6b == 'z'),
        auVar8[0xe] = -(cStack_a6a == 'i'), auVar8[0xf] = -(cStack_a69 == 'p'),
        auVar12[0] = -(cStack_a68 == 'p'), auVar12[1] = -(cStack_a67 == 'e'),
        auVar12[2] = -(cStack_a66 == 'd'), auVar12[3] = -(cStack_a65 == '\0'), auVar12[4] = 0xff,
        auVar12[5] = 0xff, auVar12[6] = 0xff, auVar12[7] = 0xff, auVar12[8] = 0xff,
        auVar12[9] = 0xff, auVar12[10] = 0xff, auVar12[0xb] = 0xff, auVar12[0xc] = 0xff,
        auVar12[0xd] = 0xff, auVar12[0xe] = 0xff, auVar12[0xf] = 0xff, auVar12 = auVar12 & auVar8,
        (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff)) ||
       (auVar9[0] = -(cStack_a71 == 't'), auVar9[1] = -(cStack_a70 == 'i'),
       auVar9[2] = -(cStack_a6f == 'o'), auVar9[3] = -(cStack_a6e == 'n'),
       auVar9[4] = -(cStack_a6d == '/'), auVar9[5] = -(cStack_a6c == 'x'),
       auVar9[6] = -(cStack_a6b == '-'), auVar9[7] = -(cStack_a6a == 'c'),
       auVar9[8] = -(cStack_a69 == 'o'), auVar9[9] = -(cStack_a68 == 'm'),
       auVar9[10] = -(cStack_a67 == 'p'), auVar9[0xb] = -(cStack_a66 == 'r'),
       auVar9[0xc] = -(cStack_a65 == 'e'), auVar9[0xd] = -(cStack_a64 == 's'),
       auVar9[0xe] = -(cStack_a63 == 's'), auVar9[0xf] = -(cStack_a62 == '\0'),
       auVar13[0] = -(local_a78 == 'a'), auVar13[1] = -(cStack_a77 == 'p'),
       auVar13[2] = -(cStack_a76 == 'p'), auVar13[3] = -(cStack_a75 == 'l'),
       auVar13[4] = -(cStack_a74 == 'i'), auVar13[5] = -(cStack_a73 == 'c'),
       auVar13[6] = -(cStack_a72 == 'a'), auVar13[7] = -(cStack_a71 == 't'),
       auVar13[8] = -(cStack_a70 == 'i'), auVar13[9] = -(cStack_a6f == 'o'),
       auVar13[10] = -(cStack_a6e == 'n'), auVar13[0xb] = -(cStack_a6d == '/'),
       auVar13[0xc] = -(cStack_a6c == 'x'), auVar13[0xd] = -(cStack_a6b == '-'),
       auVar13[0xe] = -(cStack_a6a == 'c'), auVar13[0xf] = -(cStack_a69 == 'o'),
       auVar13 = auVar13 & auVar9,
       (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff)) goto LAB_00134e81;
    auVar6[0] = -(local_a78 == 'a');
    auVar6[1] = -(cStack_a77 == 'p');
    auVar6[2] = -(cStack_a76 == 'p');
    auVar6[3] = -(cStack_a75 == 'l');
    auVar6[4] = -(cStack_a74 == 'i');
    auVar6[5] = -(cStack_a73 == 'c');
    auVar6[6] = -(cStack_a72 == 'a');
    auVar6[7] = -(cStack_a71 == 't');
    auVar6[8] = -(cStack_a70 == 'i');
    auVar6[9] = -(cStack_a6f == 'o');
    auVar6[10] = -(cStack_a6e == 'n');
    auVar6[0xb] = -(cStack_a6d == '/');
    auVar6[0xc] = -(cStack_a6c == 'x');
    auVar6[0xd] = -(cStack_a6b == '-');
    auVar6[0xe] = -(cStack_a6a == 'c');
    auVar6[0xf] = -(cStack_a69 == 'o');
    auVar10[0] = -(cStack_a6f == 'o');
    auVar10[1] = -(cStack_a6e == 'n');
    auVar10[2] = -(cStack_a6d == '/');
    auVar10[3] = -(cStack_a6c == 'x');
    auVar10[4] = -(cStack_a6b == '-');
    auVar10[5] = -(cStack_a6a == 'c');
    auVar10[6] = -(cStack_a69 == 'o');
    auVar10[7] = -(cStack_a68 == 'm');
    auVar10[8] = -(cStack_a67 == 'p');
    auVar10[9] = -(cStack_a66 == 'r');
    auVar10[10] = -(cStack_a65 == 'e');
    auVar10[0xb] = -(cStack_a64 == 's');
    auVar10[0xc] = -(cStack_a63 == 's');
    auVar10[0xd] = -(cStack_a62 == 'e');
    auVar10[0xe] = -(cStack_a61 == 'd');
    auVar10[0xf] = -(cStack_a60 == '\0');
    auVar10 = auVar10 & auVar6;
    if (((uVar2 & 0xff) == 0x1f) ||
       ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff)) goto LAB_00134e81;
    local_a88 = file_create(netoutfile,handle);
    if (local_a88 == 0) {
      closefile = closefile + 1;
      if (0x16c16c < (local_a84 * -0x5b05b05b + 0x2d82d80U >> 6 | local_a84 * -0x6c000000)) {
        snprintf(local_998,0x4b0,"Content-Length not a multiple of 2880 (http_file_open) %d");
        ffpmsg(local_998);
      }
      alarm(net_timeout);
      do {
        sVar3 = fread(local_4e8,1,0x4b0,__stream);
        if (sVar3 == 0) {
          file_close(*handle);
          piVar4 = &closefile;
          goto LAB_00134fb4;
        }
        alarm(0);
        local_a88 = file_write(*handle,local_4e8,sVar3);
      } while (local_a88 == 0);
      err_message = "Error copying http file to disk file (http_file_open)";
      goto LAB_00134f88;
    }
LAB_00134e97:
    url = "Unable to create output file (http_file_open)";
  }
  ffpmsg(url);
  url = netoutfile;
LAB_00134eaa:
  ffpmsg(url);
  alarm(0);
  if (closehttpfile != 0) {
    fclose(local_a80);
  }
  if (closeoutfile != 0) {
    fclose((FILE *)outfile);
  }
  if (closefile != 0) {
    file_close(*handle);
  }
  signal(0xe,(__sighandler_t)0x0);
  return 0x68;
}

Assistant:

int http_file_open(char *url, int rwmode, int *handle)
{
  FILE *httpfile;
  char contentencoding[SHORTLEN], contenttype[SHORTLEN];
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int contentlength;
  int ii, flen, status;
  char firstchar;

  /* Check if output file is actually a memory file */
  if (!strncmp(netoutfile, "mem:", 4) )
  {
     /* allow the memory file to be opened with write access */
     return( http_open(url, READONLY, handle) );
  }     

  closehttpfile = 0;
  closefile = 0;
  closeoutfile = 0;

  flen = strlen(netoutfile);
  if (!flen) {
      /* cfileio made a mistake, we need to know where to write the file */
      ffpmsg("Output file not set, shouldn't have happened (http_file_open)");
      return (FILE_NOT_OPENED);
  }

  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (http_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }

  signal(SIGALRM, signal_handler);
  
  /* Open the network connection */
  alarm(net_timeout);
  if ((status = http_open_network(url,&httpfile, contentencoding,
				  contenttype, &contentlength))) {
    alarm(0);
    ffpmsg("Unable to open http file (http_file_open)");
    ffpmsg(url);
    goto error;
  }

  closehttpfile++;

  if (*netoutfile == '!')
  {
     /* user wants to clobber disk file, if it already exists */
     for (ii = 0; ii < flen; ii++)
         netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

     status = file_remove(netoutfile);
  }

  firstchar = fgetc(httpfile);
  ungetc(firstchar,httpfile);
  if (!strcmp(contentencoding,"x-gzip") || 
      !strcmp(contentencoding,"x-compress") ||
      !strcmp(contenttype, "application/x-gzip") ||
      !strcmp(contenttype, "application/gzip") ||
      !strcmp(contenttype, "application/gzip-compressed") ||
      !strcmp(contenttype, "application/gzipped") ||
      !strcmp(contenttype, "application/x-compress") ||
      !strcmp(contenttype, "application/x-compressed") ||
      ('\037' == firstchar)) {

    /* to make this more cfitsioish we use the file driver calls to create
       the disk file */

    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (http_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }

    file_close(*handle);
    if (NULL == (outfile = fopen(netoutfile,"w"))) {
      ffpmsg("Unable to reopen the output file (http_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closeoutfile++;
    status = 0;

    /* Ok, this is a tough case, let's be arbritary and say 10*net_timeout,
       Given the choices for nettimeout above they'll probaby ^C before, but
       it's always worth a shot*/

    alarm(net_timeout*10);
    status = uncompress2file(url,httpfile,outfile,&status);
    alarm(0);
    if (status) {
      ffpmsg("Error uncompressing http file to disk file (http_file_open)");
      ffpmsg(url);
      ffpmsg(netoutfile);
      goto error;
    }
    fclose(outfile);
    closeoutfile--;
  } else {
    
    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (http_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    
    /* Give a warning message.  This could just be bad padding at the end
       so don't treat it like an error. */
    closefile++;
    
    if (contentlength % 2880) {
      snprintf(errorstr, MAXLEN,
	      "Content-Length not a multiple of 2880 (http_file_open) %d",
	      contentlength);
      ffpmsg(errorstr);
    }
    
    /* write a file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,httpfile))) {
      alarm(0);
      status = file_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error copying http file to disk file (http_file_open)");
        ffpmsg(url);
        ffpmsg(netoutfile);
	goto error;
      }
    }
    file_close(*handle);
    closefile--;
  }
  
  fclose(httpfile);
  closehttpfile--;

  signal(SIGALRM, SIG_DFL);
  alarm(0);

  return file_open(netoutfile,rwmode,handle); 

 error:
  alarm(0); /* clear it */
  if (closehttpfile) {
    fclose(httpfile);
  }
  if (closeoutfile) {
    fclose(outfile);
  }
  if (closefile) {
    file_close(*handle);
  } 
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}